

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormatLite::InternalWriteMessage
                    (int field_number,MessageLite *value,int cached_size,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int iVar1;
  uint8_t *puVar2;
  undefined4 extraout_var;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  int cached_size_local;
  MessageLite *value_local;
  int field_number_local;
  
  puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar2 = WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,puVar2);
  puVar2 = io::CodedOutputStream::WriteVarint32ToArray(cached_size,puVar2);
  iVar1 = (*value->_vptr_MessageLite[5])(value,puVar2,stream);
  return (uint8_t *)CONCAT44(extraout_var,iVar1);
}

Assistant:

uint8_t* WireFormatLite::InternalWriteMessage(int field_number,
                                              const MessageLite& value,
                                              int cached_size, uint8_t* target,
                                              io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  target = WriteTagToArray(field_number, WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(
      static_cast<uint32_t>(cached_size), target);
  return value._InternalSerialize(target, stream);
}